

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O1

drwav_uint64 drwav_write(drwav *pWav,drwav_uint64 samplesToWrite,void *pData)

{
  ulong uVar1;
  size_t sVar2;
  
  if (pData == (void *)0x0 || (samplesToWrite == 0 || pWav == (drwav *)0x0)) {
    return 0;
  }
  uVar1 = pWav->bitsPerSample * samplesToWrite;
  if (uVar1 < 8) {
    uVar1 = 0;
  }
  else {
    sVar2 = (*pWav->onWrite)(pWav->pUserData,pData,uVar1 >> 3);
    pWav->dataChunkDataSize = pWav->dataChunkDataSize + sVar2;
    uVar1 = sVar2 << 3;
  }
  return uVar1 / pWav->bitsPerSample;
}

Assistant:

drwav_uint64 drwav_write(drwav* pWav, drwav_uint64 samplesToWrite, const void* pData) {
    if (pWav == NULL || samplesToWrite == 0 || pData == NULL) {
        return 0;
    }

    drwav_uint64 bytesToWrite = ((samplesToWrite * pWav->bitsPerSample) / 8);
    if (bytesToWrite > SIZE_MAX) {
        return 0;
    }

    size_t bytesWritten = drwav_write_raw(pWav, (size_t)bytesToWrite, pData);
    return ((drwav_uint64)bytesWritten * 8) / pWav->bitsPerSample;
}